

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O2

Expr * inclusive_or_expr(void)

{
  Expr *pEVar1;
  Expr *pEVar2;
  
  pEVar1 = exclusive_or_expr();
  skip();
  while ((*s == '|' && (s[1] != '|'))) {
    s = s + 1;
    skip();
    pEVar2 = new_expr();
    pEVar2->type = 10;
    skip();
    pEVar2->left = pEVar1;
    pEVar1 = exclusive_or_expr();
    pEVar2->right = pEVar1;
    pEVar1 = pEVar2;
  }
  return pEVar1;
}

Assistant:

static struct Expr *inclusive_or_expr(void)
{
  struct Expr *left,*new;

  left = exclusive_or_expr();
  skip();
  while (s[0]=='|' && s[1]!='|') {
    s++;
    skip();
    new = new_expr();
    new->type = BOR;
    skip();
    new->left = left;
    new->right = exclusive_or_expr();
    left = new;
  }
  return left;
}